

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O3

int XLearnSetStr(XL *out,char *key,char *value)

{
  XL pvVar1;
  int iVar2;
  string *this;
  allocator local_41;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pvVar1 = *out;
  iVar2 = strcmp(key,"task");
  if (iVar2 == 0) {
    iVar2 = strcmp(value,"binary");
    if (iVar2 == 0) {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"cross-entropy","");
    }
    else {
      iVar2 = strcmp(value,"reg");
      local_40[0] = local_30;
      if (iVar2 == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"squared","");
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"unknow","");
      }
    }
    std::__cxx11::string::operator=((string *)((long)pvVar1 + 0x28),(string *)local_40);
    if (local_40[0] == local_30) {
      return 0;
    }
  }
  else {
    iVar2 = strcmp(key,"metric");
    if (iVar2 == 0) {
      std::__cxx11::string::string((string *)local_40,value,&local_41);
      this = (string *)((long)pvVar1 + 0x48);
    }
    else {
      iVar2 = strcmp(key,"log");
      if (iVar2 == 0) {
        std::__cxx11::string::string((string *)local_40,value,&local_41);
        this = (string *)((long)pvVar1 + 0x1c0);
      }
      else {
        iVar2 = strcmp(key,"loss");
        if (iVar2 != 0) {
          iVar2 = strcmp(key,"opt");
          if (iVar2 != 0) {
            return 0;
          }
          std::__cxx11::string::string((string *)local_40,value,&local_41);
          std::__cxx11::string::operator=((string *)((long)pvVar1 + 0x70),(string *)local_40);
          if (local_40[0] == local_30) {
            return 0;
          }
          operator_delete(local_40[0]);
          return 0;
        }
        std::__cxx11::string::string((string *)local_40,value,&local_41);
        this = (string *)((long)pvVar1 + 0x28);
      }
    }
    std::__cxx11::string::operator=(this,(string *)local_40);
    if (local_40[0] == local_30) {
      return 0;
    }
  }
  operator_delete(local_40[0]);
  return 0;
}

Assistant:

XL_DLL int XLearnSetStr(XL *out, const char *key, const char *value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "task") == 0) {
    if (strcmp(value, "binary") == 0) {
      xl->GetHyperParam().loss_func = std::string("cross-entropy");
    } else if (strcmp(value, "reg") == 0) {
      xl->GetHyperParam().loss_func = std::string("squared");
    } else {
      xl->GetHyperParam().loss_func = std::string("unknow");
    }
  } else if (strcmp(key, "metric") == 0) {
    xl->GetHyperParam().metric = std::string(value);
  } else if (strcmp(key, "log") == 0) {
    xl->GetHyperParam().log_file = std::string(value);
  } else if (strcmp(key, "loss") == 0) {
    xl->GetHyperParam().loss_func = std::string(value);
  } else if (strcmp(key, "opt") == 0) {
    xl->GetHyperParam().opt_type = std::string(value);
  }
  API_END();
}